

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O2

void Abc_WriteBoothPartialProducts(FILE *pFile,int nVars)

{
  uint n;
  uint n_00;
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int Lit;
  uint uVar6;
  uint uVar7;
  Mini_Aig_t *p;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar9;
  char *__format;
  uint uVar10;
  int local_70;
  undefined8 uVar8;
  ulong uVar11;
  
  p = Abc_GenSignedBoothMini(nVars,nVars);
  n = p->nSize / 2;
  uVar1 = Abc_Base10Log(nVars);
  n_00 = nVars * 2;
  iVar2 = Abc_Base10Log(n_00);
  uVar3 = Abc_Base10Log(n);
  uVar8 = CONCAT44(extraout_var_00,uVar3);
  fprintf((FILE *)pFile,".names pp%0*d\n",(ulong)uVar3,0);
  local_70 = 0;
  uVar9 = 0;
LAB_0028ffdd:
  do {
    while( true ) {
      uVar10 = (int)uVar9 + 1;
      uVar11 = (ulong)uVar10;
      if ((int)n <= (int)uVar10) {
        free(p->pArray);
        free(p);
        return;
      }
      iVar4 = Mini_AigNodeFanin0(p,uVar10);
      if (iVar4 != 0x7fffffff) break;
      if (nVars < (int)uVar10) {
        if ((int)n_00 < (int)uVar10) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcGen.c"
                        ,0x430,"void Abc_WriteBoothPartialProducts(FILE *, int)");
        }
        uVar9 = (ulong)(uint)((int)uVar9 - nVars);
        __format = ".names b%0*d pp%0*d\n1 1\n";
      }
      else {
        __format = ".names a%0*d pp%0*d\n1 1\n";
      }
      fprintf((FILE *)pFile,__format,(ulong)uVar1,uVar9,uVar8,(ulong)uVar10);
      uVar9 = uVar11;
    }
    iVar4 = Mini_AigNodeFanin0(p,uVar10);
    if (iVar4 != 0x7fffffff) {
      iVar4 = Mini_AigNodeFanin1(p,uVar10);
      if (iVar4 == 0x7fffffff) {
        iVar4 = Mini_AigNodeFanin0(p,uVar10);
        uVar10 = Abc_Lit2Var(iVar4);
        uVar5 = Abc_LitIsCompl(iVar4);
        fprintf((FILE *)pFile,".names pp%0*d y%0*d_%0*d\n%d 1\n",uVar8,(ulong)uVar10,(ulong)uVar1,
                (long)local_70 / (long)(int)n_00 & 0xffffffff,CONCAT44(extraout_var,iVar2),
                (long)local_70 % (long)(int)n_00 & 0xffffffff,(ulong)(uVar5 ^ 1));
        local_70 = local_70 + 1;
        uVar9 = uVar11;
        goto LAB_0028ffdd;
      }
    }
    iVar4 = Mini_AigNodeFanin0(p,uVar10);
    if (iVar4 == 0x7fffffff) {
LAB_002901ca:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcGen.c"
                    ,0x43f,"void Abc_WriteBoothPartialProducts(FILE *, int)");
    }
    iVar4 = Mini_AigNodeFanin1(p,uVar10);
    if (iVar4 == 0x7fffffff) goto LAB_002901ca;
    iVar4 = Mini_AigNodeFanin0(p,uVar10);
    Lit = Mini_AigNodeFanin1(p,uVar10);
    uVar10 = Abc_Lit2Var(iVar4);
    uVar5 = Abc_Lit2Var(Lit);
    uVar6 = Abc_LitIsCompl(iVar4);
    uVar7 = Abc_LitIsCompl(Lit);
    fprintf((FILE *)pFile,".names pp%0*d pp%0*d pp%0*d\n%d%d 1\n",uVar8,(ulong)uVar10,uVar3,
            (ulong)uVar5,uVar8,uVar11,(ulong)(uVar6 ^ 1),(ulong)(uVar7 ^ 1));
    uVar9 = uVar11;
  } while( true );
}

Assistant:

void Abc_WriteBoothPartialProducts( FILE * pFile, int nVars )
{
    Mini_Aig_t * p = Abc_GenSignedBoothMini( nVars, nVars );
    int i, nNodes = Mini_AigNodeNum(p);
    int nDigits   = Abc_Base10Log( nVars );
    int nDigits2  = Abc_Base10Log( 2*nVars );
    int nDigits3  = Abc_Base10Log( nNodes );
    int nOut = 0;
    fprintf( pFile, ".names pp%0*d\n", nDigits3, 0 );
    for ( i = 1; i < nNodes; i++ )
    {
        if ( Mini_AigNodeIsPi( p, i ) )
        {
            if ( i > 0 && i <= nVars )
                fprintf( pFile, ".names a%0*d pp%0*d\n1 1\n", nDigits, i-1,       nDigits3, i );
            else if ( i > nVars && i <= 2*nVars )
                fprintf( pFile, ".names b%0*d pp%0*d\n1 1\n", nDigits, i-1-nVars, nDigits3, i );
            else assert( 0 );
        }
        else if ( Mini_AigNodeIsPo( p, i ) )
        {
            int Lit = Mini_AigNodeFanin0( p, i );
            fprintf( pFile, ".names pp%0*d y%0*d_%0*d\n%d 1\n", nDigits3, Abc_Lit2Var(Lit), nDigits, nOut/(2*nVars), nDigits2, nOut%(2*nVars), !Abc_LitIsCompl(Lit) );
            nOut++;
        }
        else if ( Mini_AigNodeIsAnd( p, i ) )
        {
            int Lit0 = Mini_AigNodeFanin0( p, i );
            int Lit1 = Mini_AigNodeFanin1( p, i );
            fprintf( pFile, ".names pp%0*d pp%0*d pp%0*d\n%d%d 1\n", 
                nDigits3, Abc_Lit2Var(Lit0), nDigits3, Abc_Lit2Var(Lit1), nDigits3, i, !Abc_LitIsCompl(Lit0), !Abc_LitIsCompl(Lit1) );
        }
        else assert( 0 );
    }
    Mini_AigStop( p );
}